

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

IMeshSceneNode * __thiscall
irr::scene::CSceneManager::addMeshSceneNode
          (CSceneManager *this,IMesh *mesh,ISceneNode *parent,s32 id,vector3df *position,
          vector3df *rotation,vector3df *scale,bool alsoAddIfMeshPointerZero)

{
  byte bVar1;
  vector3df *in_RDX;
  vector3df *in_RSI;
  long in_RDI;
  CMeshSceneNode *in_R8;
  IReferenceCounted *in_R9;
  byte in_stack_00000010;
  IMeshSceneNode *node;
  ISceneManager *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  bVar1 = in_stack_00000010 & 1;
  if ((bVar1 == 0) && (in_RSI == (vector3df *)0x0)) {
    local_8 = (vector3df *)0x0;
  }
  else {
    if (in_RDX == (vector3df *)0x0) {
      in_RDX = (vector3df *)(in_RDI + 8);
    }
    local_8 = (vector3df *)operator_new(0x1f8);
    CMeshSceneNode::CMeshSceneNode
              (in_R8,(IMesh *)in_R9,(ISceneNode *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(s32)((ulong)in_RDI >> 0x20),local_8,in_RDX,in_RSI);
    IReferenceCounted::drop(in_R9);
  }
  return (IMeshSceneNode *)local_8;
}

Assistant:

IMeshSceneNode *CSceneManager::addMeshSceneNode(IMesh *mesh, ISceneNode *parent, s32 id,
		const core::vector3df &position, const core::vector3df &rotation,
		const core::vector3df &scale, bool alsoAddIfMeshPointerZero)
{
	if (!alsoAddIfMeshPointerZero && !mesh)
		return 0;

	if (!parent)
		parent = this;

	IMeshSceneNode *node = new CMeshSceneNode(mesh, parent, this, id, position, rotation, scale);
	node->drop();

	return node;
}